

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

void adios2::helper::anon_unknown_0::SetOption<bool>
               (bool *value,string *nodeName,Node *upperNode,string *hint,bool mandatory)

{
  bool bVar1;
  string local_80;
  Node node;
  
  std::__cxx11::string::string((string *)&local_80,(string *)nodeName);
  YAMLNode(&node,&local_80,upperNode,hint,false,Scalar);
  std::__cxx11::string::~string((string *)&local_80);
  if ((node.m_isValid == true) &&
     ((node.m_pNode == (node *)0x0 ||
      ((((((node.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    bVar1 = YAML::Node::as<bool>(&node);
    *value = bVar1;
  }
  YAML::Node::~Node(&node);
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}